

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginDataSegment
          (BinaryReaderInterp *this,Index index,Index memory_index,uint8_t flags)

{
  Result RVar1;
  Enum EVar2;
  SegmentKind kind;
  DataDesc desc;
  undefined1 local_a8 [56];
  Var local_70;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_a8._24_4_ = 0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  Var::Var(&local_70,memory_index,(Location *)local_a8);
  RVar1 = SharedValidator::OnDataSegment
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70,kind);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_a8._16_4_ = 0;
    local_a8._20_4_ = 0;
    local_a8._24_4_ = kind;
    local_a8._28_4_ = memory_index;
    std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::push_back
              (&this->module_->datas,(value_type *)local_a8);
    (this->init_expr_).kind = None;
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::BeginDataSegment(Index index,
                                            Index memory_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnDataSegment(loc, Var(memory_index), mode));

  DataDesc desc;
  desc.mode = mode;
  desc.memory_index = memory_index;
  module_.datas.push_back(desc);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}